

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void gpu_init_error_queue(void)

{
  GPU_ErrorObject *pGVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  
  if (_gpu_error_code_queue != (GPU_ErrorObject *)0x0) {
    return;
  }
  _gpu_error_code_queue = (GPU_ErrorObject *)SDL_malloc((ulong)_gpu_error_code_queue_size * 0x18);
  if (_gpu_error_code_queue_size != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar2 = SDL_malloc(0x81);
      pGVar1 = _gpu_error_code_queue;
      *(undefined8 *)((long)&_gpu_error_code_queue->function + lVar3) = uVar2;
      *(undefined4 *)((long)&pGVar1->error + lVar3) = 0;
      uVar2 = SDL_malloc(0x201);
      *(undefined8 *)((long)&_gpu_error_code_queue->details + lVar3) = uVar2;
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar4 < _gpu_error_code_queue_size);
  }
  _gpu_num_error_codes = 0;
  _gpu_error_code_result.function = (char *)SDL_malloc(0x81);
  _gpu_error_code_result.error = GPU_ERROR_NONE;
  _gpu_error_code_result.details = (char *)SDL_malloc(0x201);
  return;
}

Assistant:

static void gpu_init_error_queue(void)
{
    if(_gpu_error_code_queue == NULL)
    {
        unsigned int i;
        _gpu_error_code_queue = (GPU_ErrorObject*)SDL_malloc(sizeof(GPU_ErrorObject)*_gpu_error_code_queue_size);

        for(i = 0; i < _gpu_error_code_queue_size; i++)
        {
            _gpu_error_code_queue[i].function = (char*)SDL_malloc(GPU_ERROR_FUNCTION_STRING_MAX+1);
            _gpu_error_code_queue[i].error = GPU_ERROR_NONE;
            _gpu_error_code_queue[i].details = (char*)SDL_malloc(GPU_ERROR_DETAILS_STRING_MAX+1);
        }
        _gpu_num_error_codes = 0;

        _gpu_error_code_result.function = (char*)SDL_malloc(GPU_ERROR_FUNCTION_STRING_MAX+1);
        _gpu_error_code_result.error = GPU_ERROR_NONE;
        _gpu_error_code_result.details = (char*)SDL_malloc(GPU_ERROR_DETAILS_STRING_MAX+1);
    }
}